

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_timer.c
# Opt level: O2

void test_create_timer_eventloop_add_fails(void)

{
  cio_error cVar1;
  cio_timer timer;
  
  timerfd_create_fake.return_val = 5;
  cio_linux_eventloop_add_fake.return_val = CIO_INVALID_ARGUMENT;
  cVar1 = cio_timer_init(&timer,(cio_eventloop *)0x0,(cio_timer_close_hook_t)0x0);
  if (cVar1 != CIO_SUCCESS) {
    UnityAssertEqualNumber
              (1,(ulong)cio_linux_eventloop_add_fake.call_count,(char *)0x0,0xb9,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)cio_linux_eventloop_register_read_fake.call_count,(char *)0x0,0xba,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber(1,(ulong)close_fake.call_count,(char *)0x0,0xbb,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber(5,(long)close_fake.arg0_val,(char *)0x0,0xbc,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)cio_linux_eventloop_remove_fake.call_count,(char *)0x0,0xbd,
               UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail(" Expression Evaluated To FALSE",0xb8);
}

Assistant:

static void test_create_timer_eventloop_add_fails(void)
{
	static const int timerfd = 5;
	timerfd_create_fake.return_val = timerfd;
	cio_linux_eventloop_add_fake.return_val = CIO_INVALID_ARGUMENT;

	struct cio_timer timer;
	enum cio_error err = cio_timer_init(&timer, NULL, NULL);
	TEST_ASSERT(err != CIO_SUCCESS);
	TEST_ASSERT_EQUAL(1, cio_linux_eventloop_add_fake.call_count);
	TEST_ASSERT_EQUAL(0, cio_linux_eventloop_register_read_fake.call_count);
	TEST_ASSERT_EQUAL(1, close_fake.call_count);
	TEST_ASSERT_EQUAL(timerfd, close_fake.arg0_val);
	TEST_ASSERT_EQUAL(0, cio_linux_eventloop_remove_fake.call_count);
}